

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_225155::OSScapture::open(OSScapture *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  ALuint limit_writes;
  ALuint AVar3;
  ALCuint a;
  backend_exception *pbVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  backend_exception *pbVar8;
  ALCchar *pAVar9;
  audio_buf_info info;
  ALuint numFragmentsLogSize;
  ALuint log2FragmentSize;
  ALuint ossSpeed;
  ALuint frameSize;
  ALuint numChannels;
  ALuint periods;
  int ossFormat;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  iter;
  char *devname;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_fffffffffffffec8;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  *in_stack_fffffffffffffed0;
  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  *in_stack_fffffffffffffee0;
  anon_class_8_1_898f2789_for__M_pred in_stack_fffffffffffffee8;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_fffffffffffffef0;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  vector<DevMap> *in_stack_ffffffffffffff50;
  undefined1 local_78 [16];
  uint local_68;
  uint local_64;
  ALuint local_60;
  int local_5c;
  ALuint local_58;
  uint local_54;
  uint uVar10;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  local_20;
  char *local_18;
  char *local_10;
  OSScapture *local_8;
  
  local_10 = __file;
  local_8 = this;
  local_18 = (char *)std::__cxx11::string::c_str();
  if (local_10 == (char *)0x0) {
    local_10 = "OSS Default";
  }
  else {
    bVar1 = std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::empty(in_stack_fffffffffffffee0);
    if (bVar1) {
      ALCossListPopulate(in_stack_ffffffffffffff50,(int)(in_stack_ffffffffffffff48 >> 0x20));
    }
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cbegin(in_stack_fffffffffffffec8);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cend(in_stack_fffffffffffffec8);
    local_20 = std::
               find_if<__gnu_cxx::__normal_iterator<(anonymous_namespace)::DevMap_const*,std::vector<(anonymous_namespace)::DevMap,al::allocator<(anonymous_namespace)::DevMap,8ul>>>,(anonymous_namespace)::OSScapture::open(char_const*)::__0>
                         (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffee8);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    cend(in_stack_fffffffffffffec8);
    bVar1 = __gnu_cxx::operator==
                      (in_stack_fffffffffffffed0,
                       (__normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
                        *)in_stack_fffffffffffffec8);
    if (bVar1) {
      pbVar4 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception
                (pbVar4,0xa004,"Device name \"%s\" not found",local_10);
      __cxa_throw(pbVar4,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
    ::operator->(&local_20);
    local_18 = (char *)std::__cxx11::string::c_str();
  }
  iVar2 = ::open(local_18,0);
  this->mFd = iVar2;
  if (this->mFd == -1) {
    pbVar4 = (backend_exception *)__cxa_allocate_exception(0x30);
    pcVar7 = local_18;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    al::backend_exception::backend_exception(pbVar4,0xa004,"Could not open %s: %s",pcVar7,pcVar6);
    __cxa_throw(pbVar4,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  uVar10 = 0;
  switch(((this->super_BackendBase).mDevice)->FmtType) {
  case DevFmtByte:
    uVar10 = 0x40;
    break;
  case DevFmtUByte:
    uVar10 = 8;
    break;
  case DevFmtShort:
    uVar10 = 0x10;
    break;
  case DevFmtUShort:
  case DevFmtInt:
  case DevFmtUInt:
  case DevFmtFloat:
    pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
    pbVar4 = pbVar8;
    pAVar9 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    al::backend_exception::backend_exception
              (pbVar4,0xa004,"%s capture samples not supported",pAVar9);
    __cxa_throw(pbVar8,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  local_54 = 4;
  limit_writes = ALCdevice::channelsFromFmt((ALCdevice *)0x239ed2);
  local_58 = limit_writes;
  AVar3 = ALCdevice::bytesFromFmt((ALCdevice *)0x239ef7);
  local_5c = limit_writes * AVar3;
  local_60 = ((this->super_BackendBase).mDevice)->Frequency;
  a = log2i((((this->super_BackendBase).mDevice)->BufferSize * local_5c) / local_54);
  local_64 = maxu(a,4);
  local_68 = local_54 << 0x10 | local_64;
  memset(local_78,0,0x10);
  iVar2 = ioctl(this->mFd,0xc004500a,&local_68);
  if (iVar2 < 0) {
    pbVar4 = (backend_exception *)__cxa_allocate_exception(0x30);
    piVar5 = __errno_location();
    pcVar7 = strerror(*piVar5);
    al::backend_exception::backend_exception
              (pbVar4,0xa004,"ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize) failed: %s",
               pcVar7);
    __cxa_throw(pbVar4,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  iVar2 = ioctl(this->mFd,0xc0045005,&stack0xffffffffffffffb0);
  if (iVar2 < 0) {
    pbVar4 = (backend_exception *)__cxa_allocate_exception(0x30);
    piVar5 = __errno_location();
    pcVar7 = strerror(*piVar5);
    al::backend_exception::backend_exception
              (pbVar4,0xa004,"ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat) failed: %s",pcVar7);
    __cxa_throw(pbVar4,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  iVar2 = ioctl(this->mFd,0xc0045006,&local_58);
  if (iVar2 < 0) {
    pbVar4 = (backend_exception *)__cxa_allocate_exception(0x30);
    piVar5 = __errno_location();
    pcVar7 = strerror(*piVar5);
    al::backend_exception::backend_exception
              (pbVar4,0xa004,"ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels) failed: %s",pcVar7);
    __cxa_throw(pbVar4,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  iVar2 = ioctl(this->mFd,0xc0045002,&local_60);
  if (iVar2 < 0) {
    pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
    pbVar4 = pbVar8;
    piVar5 = __errno_location();
    pcVar7 = strerror(*piVar5);
    al::backend_exception::backend_exception
              (pbVar8,0xa004,"ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed) failed: %s",pcVar7);
    __cxa_throw(pbVar4,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  iVar2 = ioctl(this->mFd,0x8010500d,local_78);
  if (-1 < iVar2) {
    AVar3 = ALCdevice::channelsFromFmt((ALCdevice *)0x23a298);
    if (AVar3 != local_58) {
      pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
      pbVar4 = pbVar8;
      pAVar9 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
      al::backend_exception::backend_exception
                (pbVar4,0xa004,"Failed to set %s, got %d channels instead",pAVar9,(ulong)local_58);
      __cxa_throw(pbVar8,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    if ((((uVar10 != 0x40) || (((this->super_BackendBase).mDevice)->FmtType != DevFmtByte)) &&
        ((uVar10 != 8 || (((this->super_BackendBase).mDevice)->FmtType != DevFmtUByte)))) &&
       ((uVar10 != 0x10 || (((this->super_BackendBase).mDevice)->FmtType != DevFmtShort)))) {
      pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
      pbVar4 = pbVar8;
      pAVar9 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
      al::backend_exception::backend_exception
                (pbVar4,0xa004,"Failed to set %s samples, got OSS format %#x",pAVar9,(ulong)uVar10);
      __cxa_throw(pbVar8,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception)
      ;
    }
    RingBuffer::Create(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,limit_writes);
    std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator=
              ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)in_stack_fffffffffffffed0
               ,(unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
                in_stack_fffffffffffffec8);
    std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::~unique_ptr
              ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)in_stack_fffffffffffffed0
              );
    iVar2 = std::__cxx11::string::operator=
                      ((string *)&((this->super_BackendBase).mDevice)->DeviceName,local_10);
    return iVar2;
  }
  pbVar8 = (backend_exception *)__cxa_allocate_exception(0x30);
  pbVar4 = pbVar8;
  piVar5 = __errno_location();
  pcVar7 = strerror(*piVar5);
  al::backend_exception::backend_exception
            (pbVar4,0xa004,"ioctl(mFd, SNDCTL_DSP_GETISPACE, &info) failed: %s",pcVar7);
  __cxa_throw(pbVar8,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
}

Assistant:

void OSScapture::open(const ALCchar *name)
{
    const char *devname{DefaultCapture.c_str()};
    if(!name)
        name = DefaultName;
    else
    {
        if(CaptureDevices.empty())
            ALCossListPopulate(CaptureDevices, DSP_CAP_INPUT);

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [&name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        devname = iter->device_name.c_str();
    }

    mFd = ::open(devname, O_RDONLY);
    if(mFd == -1)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open %s: %s", devname,
            strerror(errno)};

    int ossFormat{};
    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        ossFormat = AFMT_S8;
        break;
    case DevFmtUByte:
        ossFormat = AFMT_U8;
        break;
    case DevFmtShort:
        ossFormat = AFMT_S16_NE;
        break;
    case DevFmtUShort:
    case DevFmtInt:
    case DevFmtUInt:
    case DevFmtFloat:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }

    ALuint periods{4};
    ALuint numChannels{mDevice->channelsFromFmt()};
    ALuint frameSize{numChannels * mDevice->bytesFromFmt()};
    ALuint ossSpeed{mDevice->Frequency};
    /* according to the OSS spec, 16 bytes are the minimum */
    ALuint log2FragmentSize{maxu(log2i(mDevice->BufferSize * frameSize / periods), 4)};
    ALuint numFragmentsLogSize{(periods << 16) | log2FragmentSize};

    audio_buf_info info{};
#define CHECKERR(func) if((func) < 0) {                                       \
    throw al::backend_exception{ALC_INVALID_VALUE, #func " failed: %s", strerror(errno)}; \
}
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_GETISPACE, &info));
#undef CHECKERR

    if(mDevice->channelsFromFmt() != numChannels)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set %s, got %d channels instead", DevFmtChannelsString(mDevice->FmtChans),
            numChannels};

    if(!((ossFormat == AFMT_S8 && mDevice->FmtType == DevFmtByte)
        || (ossFormat == AFMT_U8 && mDevice->FmtType == DevFmtUByte)
        || (ossFormat == AFMT_S16_NE && mDevice->FmtType == DevFmtShort)))
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set %s samples, got OSS format %#x", DevFmtTypeString(mDevice->FmtType),
            ossFormat};

    mRing = RingBuffer::Create(mDevice->BufferSize, frameSize, false);

    mDevice->DeviceName = name;
}